

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  anon_class_56_7_7e142ac4 __f;
  pointer ppVar3;
  pointer ppVar4;
  undefined1 auVar5 [8];
  bool bVar6;
  path *ppVar7;
  basic_ostream<char,_std::char_traits<char>_> *pbVar8;
  long lVar9;
  ostream *poVar10;
  pointer pcVar11;
  undefined8 uVar12;
  ulong uVar13;
  long lVar14;
  undefined8 in_R8;
  undefined8 in_R9;
  path *d;
  long lVar15;
  difference_type __d;
  element_type *peVar16;
  element_type *peVar17;
  type_conflict tVar18;
  double dVar19;
  undefined1 auVar20 [16];
  char *pcVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  vector<double,_std::allocator<double>_> v;
  string output_dir;
  recursive_directory_iterator __end1;
  string mkdir_command;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> data_files
  ;
  vector<double,_std::allocator<double>_> v2;
  ofstream output_file;
  ifstream f;
  undefined1 *puVar24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined1 *puVar25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  vector<double,_std::allocator<double>_> *pvVar26;
  undefined1 *puVar27;
  element_type *local_558;
  element_type *in_stack_fffffffffffffab0;
  element_type *peVar28;
  pointer in_stack_fffffffffffffab8;
  undefined1 in_stack_fffffffffffffac0 [16];
  undefined8 in_stack_fffffffffffffad0;
  _Alloc_hider _Var29;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffae0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> local_4c8;
  vector<double,_std::allocator<double>_> local_4b0;
  recursive_directory_iterator local_498;
  double local_488;
  recursive_directory_iterator local_480;
  istream_iterator<double,_char,_std::char_traits<char>,_long> local_470;
  undefined1 local_458 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_448;
  undefined1 *puStack_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_438;
  vector<double,_std::allocator<double>_> *pvStack_430;
  undefined8 local_428;
  ios_base local_360 [264];
  istream_iterator<double,_char,_std::char_traits<char>,_long> local_258;
  path local_238 [13];
  
  local_4c8.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_start = (path *)0x0;
  local_4c8.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = (path *)0x0;
  local_4c8.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_458 = (undefined1  [8])getenv("HOME");
  std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
            (local_238,(char **)local_458,auto_format);
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)&stack0xfffffffffffffad8,local_238,none,
             (error_code *)0x0);
  std::filesystem::__cxx11::path::~path(local_238);
  if (in_stack_fffffffffffffae0._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_4e8._M_string_length = 0;
  }
  else {
    local_4e8._M_string_length = (size_type)in_stack_fffffffffffffae0._M_pi;
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(in_stack_fffffffffffffae0._M_pi + 8) =
           *(int *)(in_stack_fffffffffffffae0._M_pi + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(in_stack_fffffffffffffae0._M_pi + 8) =
           *(int *)(in_stack_fffffffffffffae0._M_pi + 8) + 1;
    }
  }
  local_498._M_dirs._M_ptr = (element_type *)0x0;
  local_498._M_dirs._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_498);
  if (in_stack_fffffffffffffae0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(in_stack_fffffffffffffae0._M_pi + 8) =
           *(int *)(in_stack_fffffffffffffae0._M_pi + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(in_stack_fffffffffffffae0._M_pi + 8) =
           *(int *)(in_stack_fffffffffffffae0._M_pi + 8) + 1;
    }
  }
  local_508._M_dataplus._M_p = (pointer)0x0;
  local_508._M_string_length = 0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_480);
  paVar1 = &local_238[0]._M_pathname.field_2;
  while (local_4e8._M_string_length != local_508._M_string_length) {
    ppVar7 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*
                               ((recursive_directory_iterator *)&local_4e8);
    pcVar11 = (ppVar7->_M_pathname)._M_dataplus._M_p;
    local_238[0]._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_238,pcVar11,pcVar11 + (ppVar7->_M_pathname)._M_string_length);
    local_458 = (undefined1  [8])local_238[0]._M_pathname._M_string_length;
    paStack_450 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238[0]._M_pathname._M_dataplus._M_p;
    bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::ends_with
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_458,
                       "_rse_workshop.dat");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238[0]._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_238[0]._M_pathname._M_dataplus._M_p,
                      local_238[0]._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if (bVar6) {
      std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>::
      emplace_back<std::filesystem::__cxx11::path_const&>
                ((vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                  *)&local_4c8,ppVar7);
    }
    std::filesystem::__cxx11::recursive_directory_iterator::operator++
              ((recursive_directory_iterator *)&local_4e8);
  }
  this_00 = &local_508;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)this_00);
  this = &local_4e8;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)this);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&stack0xfffffffffffffad8);
  ppVar4 = local_4c8.
           super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar3 = local_4c8.
           super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_4c8.
      super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_4c8.
      super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar13 = ((long)local_4c8.
                    super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_4c8.
                    super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    lVar9 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::path*,std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_4c8.
               super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_4c8.
               super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::path*,std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar3,ppVar4);
    ppVar3 = local_4c8.
             super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar7 = local_4c8.
                  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar3; ppVar7 = ppVar7 + 1)
    {
      pbVar8 = std::filesystem::__cxx11::operator<<
                         ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,ppVar7);
      std::ios::widen((char)*(undefined8 *)(*(long *)pbVar8 + -0x18) + (char)pbVar8);
      std::ostream::put((char)pbVar8);
      std::ostream::flush();
    }
  }
  std::ifstream::ifstream
            (local_238,
             ((local_4c8.
               super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_pathname)._M_dataplus._M_p,_S_in);
  local_470._M_ok = true;
  local_470._M_stream = (istream_type *)local_238;
  std::istream_iterator<double,_char,_std::char_traits<char>,_long>::_M_read(&local_470);
  local_258._M_stream = (istream_type *)0x0;
  local_258._M_value = 0.0;
  local_258._M_ok = false;
  std::vector<double,std::allocator<double>>::
  vector<std::istream_iterator<double,char,std::char_traits<char>,long>,void>
            ((vector<double,std::allocator<double>> *)&local_558,&local_470,&local_258,
             (allocator_type *)local_458);
  local_508._M_dataplus._M_p = (pointer)0x0;
  local_458 = (undefined1  [8])&__pstl::execution::v1::par;
  puVar25 = &stack0xfffffffffffffacf;
  pvVar26 = &local_4b0;
  puVar27 = &stack0xffffffffffffface;
  puVar24 = &__pstl::execution::v1::par;
  __f.__first = (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                in_stack_fffffffffffffab8;
  __f.__exec = (parallel_policy *)in_stack_fffffffffffffab0;
  __f.__last = (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffffac0._0_8_;
  __f.__unary_op = (__no_op *)in_stack_fffffffffffffac0._8_8_;
  __f.__init = (double *)in_stack_fffffffffffffad0;
  __f.__binary_op = (plus<double> *)local_558;
  __f.__is_vector = (integral_constant<bool,_false> *)in_stack_fffffffffffffae0._M_pi;
  pcVar21 = &stack0xfffffffffffffad8;
  paStack_450 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&stack0xfffffffffffffad8;
  local_448 = this;
  puStack_440 = puVar25;
  local_438 = this_00;
  pvStack_430 = pvVar26;
  local_428 = puVar27;
  tVar18 = __pstl::__internal::
           __except_handler<__pstl::__internal::__pattern_transform_reduce<__pstl::execution::v1::parallel_policy_const&,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double,std::plus<double>,__pstl::__internal::__no_op,std::integral_constant<bool,false>>(__pstl::execution::v1::parallel_policy_const&,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double,std::plus<double>,__pstl::__internal::__no_op,std::integral_constant<bool,false>,std::integral_constant<bool,true>)::_lambda()_1_>
                     (__f);
  peVar16 = local_558;
  peVar17 = in_stack_fffffffffffffab0;
  dVar19 = __pstl::__internal::
           __pattern_transform_reduce<__pstl::execution::v1::parallel_unsequenced_policy_const&,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double,std::plus<double>,std::multiplies<double>,std::integral_constant<bool,true>>
                     (0,&__pstl::execution::v1::par_unseq,local_558,in_stack_fffffffffffffab0,
                      local_558,in_R8,in_R9,puVar24,pcVar21,this,puVar25,this_00,pvVar26,puVar27);
  lVar15 = (long)in_stack_fffffffffffffab0 - (long)peVar16 >> 3;
  auVar22._8_4_ = (int)((long)in_stack_fffffffffffffab0 - (long)peVar16 >> 0x23);
  auVar22._0_8_ = lVar15;
  auVar22._12_4_ = 0x45300000;
  lVar9 = (long)peVar17 - (long)local_558 >> 3;
  auVar23._8_4_ = (int)((long)peVar17 - (long)local_558 >> 0x23);
  auVar23._0_8_ = lVar9;
  auVar23._12_4_ = 0x45300000;
  pcVar21 = (char *)(tVar18 / ((auVar22._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0)));
  local_488 = dVar19 / ((auVar23._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) -
              (double)pcVar21 * (double)pcVar21;
  if (local_488 < 0.0) {
    dVar19 = sqrt(local_488);
  }
  else {
    dVar19 = SQRT(local_488);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"mean:   ",8);
  poVar10 = std::ostream::_M_insert<double>((double)pcVar21);
  local_458[0] = (allocator_type)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_458,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"var:    ",8);
  poVar10 = std::ostream::_M_insert<double>(local_488);
  local_458[0] = (allocator_type)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_458,1);
  local_428._0_2_ = CONCAT11(1,(undefined1)local_428);
  local_458 = (undefined1  [8])0x0;
  local_4e8._M_dataplus._M_p = (pointer)&PTR_operator___0010fb80;
  _Var29._M_p = (pointer)local_558;
  _Var30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar17;
  local_518._M_allocated_capacity = (size_type)local_458;
  local_4e8._M_string_length = (size_type)&stack0xfffffffffffffad8;
  paStack_450 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar21;
  local_448 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dVar19;
  local_438 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar21;
  pvStack_430 = (vector<double,_std::allocator<double>_> *)dVar19;
  tbb::detail::r1::isolate_within_arena((delegate_base *)&local_4e8,0);
  auVar5 = local_458;
  peVar16 = local_558;
  peVar28 = peVar17;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"skew:   ",8);
  lVar9 = (long)peVar17 - (long)peVar16 >> 3;
  auVar20._8_4_ = (int)((long)peVar17 - (long)peVar16 >> 0x23);
  auVar20._0_8_ = lVar9;
  auVar20._12_4_ = 0x45300000;
  poVar10 = std::ostream::_M_insert<double>
                      ((double)auVar5 /
                       ((auVar20._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)));
  local_458[0] = (allocator_type)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_458,1);
  pcVar11 = (pointer)std::chrono::_V2::system_clock::now();
  std::vector<double,_std::allocator<double>_>::vector
            (&local_4b0,(vector<double,_std::allocator<double>_> *)&local_558);
  peVar16 = (element_type *)
            ((ulong)((long)local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3) >> 1);
  __pstl::__internal::
  __pattern_nth_element<__pstl::execution::v1::parallel_policy_const&,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::less<double>,std::integral_constant<bool,false>>
            (&__pstl::execution::v1::par,
             local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + (long)peVar16);
  if ((element_type *)
      ((long)local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start >> 3) <= peVar16) {
    uVar12 = std::__throw_out_of_range_fmt
                       ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                        peVar16);
    if (local_508._M_dataplus._M_p != pcVar11) {
      operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
      operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
    }
    if ((element_type *)_Var29._M_p != peVar16) {
      operator_delete(_Var29._M_p,(ulong)(local_518._M_allocated_capacity + 1));
    }
    if (local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_558 != (element_type *)0x0) {
      operator_delete(local_558,(long)in_stack_fffffffffffffab8 - (long)local_558);
    }
    std::ifstream::~ifstream(local_238);
    std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
    ~vector(&local_4c8);
    _Unwind_Resume(uVar12);
  }
  dVar2 = local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[(long)peVar16];
  lVar9 = std::chrono::_V2::system_clock::now();
  *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) &
       0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"median took ",0xc);
  poVar10 = std::ostream::_M_insert<double>((double)(lVar9 - (long)pcVar11) / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," ms\n",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"median: ",8);
  poVar10 = std::ostream::_M_insert<double>(dVar2);
  local_458[0] = (allocator_type)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_458,1);
  if ((long)peVar28 - (long)local_558 != 0) {
    lVar15 = (long)peVar28 - (long)local_558 >> 3;
    peVar16 = local_558;
    lVar9 = 4;
    if (lVar15 < 4) {
      lVar9 = lVar15;
    }
    do {
      if (0 < lVar9) {
        bVar6 = true;
        lVar15 = 0;
        do {
          if (50.0 < *(double *)(peVar16 + lVar15 * 8)) {
            bVar6 = false;
          }
          lVar15 = lVar15 + 1;
        } while (lVar9 != lVar15);
        if (!bVar6) break;
      }
      peVar16 = peVar16 + lVar9 * 8;
      lVar14 = (long)peVar28 - (long)peVar16 >> 3;
      lVar15 = lVar9 * 2;
      if (SBORROW8(lVar14,lVar9 * 2) != lVar14 + lVar9 * -2 < 0) {
        lVar15 = lVar14;
      }
      lVar9 = lVar15;
    } while (peVar28 != peVar16);
  }
  *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) | 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Any greater than 50? ",0x15);
  poVar10 = std::ostream::_M_insert<bool>(true);
  local_458[0] = (allocator_type)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_458,1);
  peVar16 = local_558 + 8;
  peVar17 = local_558;
  if (local_558 != peVar28 + -8) {
    do {
      peVar17 = peVar16;
      if (dVar19 + dVar19 <= ABS(*(double *)(peVar17 + -8) - *(double *)peVar17)) {
        peVar16 = peVar17;
        peVar17 = peVar17 + -8;
        break;
      }
      peVar16 = peVar17 + 8;
    } while (peVar17 != peVar28 + -8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Position ",9);
  poVar10 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,", first ",8);
  poVar10 = std::ostream::_M_insert<double>(*(double *)peVar17);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," second: ",9);
  poVar10 = std::ostream::_M_insert<double>(*(double *)peVar16);
  local_458[0] = (allocator_type)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_458,1);
  _Var29._M_p = (pointer)&local_518;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffad8,"./output","");
  std::operator+(&local_4e8,"mkdir -p ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffad8);
  system(local_4e8._M_dataplus._M_p);
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_508,_Var29._M_p,(element_type *)(_Var30._M_pi + (long)_Var29._M_p));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_508,"/results.dat");
  std::ofstream::ofstream(local_458,(string *)&local_508,_S_out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  std::ostream::_M_insert<double>(*(double *)local_558);
  if (8 < (ulong)((long)peVar28 - (long)local_558)) {
    uVar13 = 1;
    do {
      local_508._M_dataplus._M_p._0_1_ = 0x2c;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,(char *)&local_508,1);
      std::ostream::_M_insert<double>(*(double *)(local_558 + uVar13 * 8));
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ulong)((long)peVar28 - (long)local_558 >> 3));
  }
  std::ofstream::close();
  local_458 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_458 + *(long *)(_VTT + -0x18)) = _sqrt;
  std::filebuf::~filebuf((filebuf *)&paStack_450);
  std::ios_base::~ios_base(local_360);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var29._M_p != &local_518) {
    operator_delete(_Var29._M_p,(ulong)(local_518._M_allocated_capacity + 1));
  }
  if (local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_558 != (element_type *)0x0) {
    operator_delete(local_558,(long)in_stack_fffffffffffffab8 - (long)local_558);
  }
  std::ifstream::~ifstream(local_238);
  std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  ~vector(&local_4c8);
  return 0;
}

Assistant:

int main()
{
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 1. Reading some data in from a file
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Find all files like *_rse_workshop.dat under a specific directory
    std::vector<fs::path> data_files;
    for (auto &p : fs::recursive_directory_iterator(std::getenv("HOME")))
    {
        if (p.path().string().ends_with("_rse_workshop.dat"))
        {
            data_files.emplace_back(p.path());
        }
    }

    // This is just to make sure the same file is first, so the numbers later are the same on each version.
    // The sort isn't necessary!
    std::sort(data_files.begin(), data_files.end());

    // Which data files did we find? (range-for loop)
    for (const auto &d : data_files)
    {
        std::cout << d << std::endl;
    }

    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 2. Calculate the mean and standard deviation of some data
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Read some data in
    std::ifstream f(data_files[0]);
    std::vector<double> v{std::istream_iterator<double>(f), std::istream_iterator<double>()};

    const double mean = std::reduce(std::execution::par, v.begin(), v.end(), 0.0) / v.size();
    const double var =
        std::transform_reduce(std::execution::par_unseq, v.begin(), v.end(), v.begin(), 0.0) / v.size() - mean * mean;
    const double std = std::sqrt(var);

    std::cout << "mean:   " << mean << '\n';
    std::cout << "var:    " << var << '\n';

    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 3. Calculate the skewness - there's no default algorithm for that!
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Compute skewness
    auto third_moment = [mean, std](const double x) { return std::pow((x - mean) / std, 3); };
    const double skew =
        std::transform_reduce(std::execution::par, v.begin(), v.end(), 0.0, std::plus<>(), third_moment) / v.size();

    std::cout << "skew:   " << skew << '\n';

    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 4. Calculate the median (and bonus chrono)
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    auto t1 = std::chrono::high_resolution_clock::now();

    // Take a copy of the vector so we can sort it
    std::vector<double> v2 = v;

    auto half_way = v2.size() / 2;
    std::nth_element(std::execution::par, v2.begin(), std::next(v2.begin(), half_way), v2.end());
    const double median = v2.at(half_way);

    auto t2 = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double, std::milli> ms = t2 - t1;
    std::cout << std::fixed << "median took " << ms.count() << " ms\n";

    std::cout << "median: " << median << '\n';

    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 5. What other algorithms are there?
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Any of the elements > 50?
    const bool any_greater_than_50 =
        std::any_of(std::execution::unseq, v.begin(), v.end(), [](const double x) { return x > 50.0; });
    std::cout << std::boolalpha << "Any greater than 50? " << any_greater_than_50 << '\n';

    // First position where consecutive elements differ by more than twice the standard deviation
    auto comparison = [std](const double x, const double y) { return std::fabs(x - y) < 2.0 * std; };
    const auto answer = std::mismatch(v.begin(), std::prev(v.end()), std::next(v.begin()), comparison);

    const auto dist = std::distance(v.begin(), answer.first);
    std::cout << "Position " << dist << ", first " << *answer.first << " second: " << *answer.second << '\n';

    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 7. Writing some data back out to a csv file - pulling several concepts together
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    std::string output_dir = "./output";
    std::string mkdir_command = "mkdir -p " + output_dir;
    // System takes a const char* as a parameter
    system(mkdir_command.c_str());

    // Create an output file
    std::ofstream output_file(output_dir + "/results.dat");
    output_file << v[0];
    for (int i = 1; i < v.size(); i++)
    {
        output_file << ',' << v[i];
    }
    output_file.close();
}